

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5UnicodeTokenize(Fts5Tokenizer *pTokenizer,void *pCtx,int iUnused,char *pText,int nText,
                       _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *in_RCX;
  byte *pbVar8;
  undefined8 in_RSI;
  long in_RDI;
  int in_R8D;
  code *in_R9;
  bool bVar9;
  int ie;
  int is;
  char *zOut;
  u32 iCode;
  char *pEnd;
  int nFold;
  char *aFold;
  uchar *zCsr;
  uchar *zTerm;
  uchar *a;
  int rc;
  Unicode61Tokenizer *p;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  int local_84;
  byte *local_80;
  uint local_74;
  int local_64;
  byte *local_60;
  byte *local_58;
  int local_3c;
  
  local_3c = 0;
  pbVar6 = in_RCX + in_R8D;
  local_60 = *(byte **)(in_RDI + 0x80);
  local_64 = *(int *)(in_RDI + 0x88);
  pbVar7 = local_60 + (local_64 + -6);
  local_58 = in_RCX;
  while (local_3c == 0) {
    local_80 = local_60;
    do {
      while( true ) {
        if (pbVar6 <= local_58) goto LAB_0028fcbe;
        iVar1 = (int)in_RCX;
        if ((*local_58 & 0x80) != 0) break;
        if (*(char *)(in_RDI + (ulong)*local_58) != '\0') {
          local_84 = (int)local_58 - iVar1;
          goto LAB_0028fc0a;
        }
        local_58 = local_58 + 1;
      }
      local_84 = (int)local_58 - iVar1;
      pbVar8 = local_58 + 1;
      bVar2 = *local_58;
      local_58 = pbVar8;
      if (0xbf < bVar2) {
        while( true ) {
          bVar9 = false;
          if (local_58 < pbVar6) {
            bVar9 = (*local_58 & 0xc0) == 0x80;
          }
          if (!bVar9) break;
          local_58 = local_58 + 1;
        }
        in_stack_ffffffffffffff77 = 0;
      }
      iVar3 = fts5UnicodeIsAlnum((Unicode61Tokenizer *)
                                 CONCAT17(in_stack_ffffffffffffff77,
                                          CONCAT16(in_stack_ffffffffffffff76,
                                                   in_stack_ffffffffffffff70)),
                                 in_stack_ffffffffffffff6c);
    } while (iVar3 == 0);
    do {
      uVar5 = sqlite3Fts5UnicodeFold((int)((ulong)pbVar7 >> 0x20),(int)pbVar7);
      if (uVar5 != 0) {
        bVar2 = (byte)uVar5;
        if (uVar5 < 0x80) {
          *local_80 = bVar2;
          local_80 = local_80 + 1;
        }
        else if (uVar5 < 0x800) {
          pbVar8 = local_80 + 1;
          *local_80 = ((byte)(uVar5 >> 6) & 0x1f) - 0x40;
          local_80 = local_80 + 2;
          *pbVar8 = (bVar2 & 0x3f) + 0x80;
        }
        else if (uVar5 < 0x10000) {
          *local_80 = ((byte)(uVar5 >> 0xc) & 0xf) - 0x20;
          pbVar8 = local_80 + 2;
          local_80[1] = ((byte)(uVar5 >> 6) & 0x3f) + 0x80;
          local_80 = local_80 + 3;
          *pbVar8 = (bVar2 & 0x3f) + 0x80;
        }
        else {
          *local_80 = ((byte)(uVar5 >> 0x12) & 7) - 0x10;
          local_80[1] = ((byte)(uVar5 >> 0xc) & 0x3f) + 0x80;
          pbVar8 = local_80 + 3;
          local_80[2] = ((byte)(uVar5 >> 6) & 0x3f) + 0x80;
          local_80 = local_80 + 4;
          *pbVar8 = (bVar2 & 0x3f) + 0x80;
        }
      }
      while( true ) {
        iVar3 = (int)local_58;
        if (pbVar6 <= local_58) goto LAB_0028fc86;
        if (pbVar7 < local_80) {
          local_60 = (byte *)sqlite3_malloc64(CONCAT44(in_stack_ffffffffffffff6c,
                                                       in_stack_ffffffffffffff68));
          if (local_60 == (byte *)0x0) {
            local_3c = 7;
            goto LAB_0028fcbe;
          }
          local_80 = local_60 + ((long)local_80 - *(long *)(in_RDI + 0x80));
          memcpy(local_60,*(void **)(in_RDI + 0x80),(long)local_64);
          sqlite3_free((void *)0x28f8d1);
          *(byte **)(in_RDI + 0x80) = local_60;
          local_64 = local_64 * 2;
          *(int *)(in_RDI + 0x88) = local_64;
          pbVar7 = local_60 + (local_64 + -6);
        }
        if ((*local_58 & 0x80) != 0) break;
        if (*(char *)(in_RDI + (ulong)*local_58) == '\0') goto LAB_0028fc86;
LAB_0028fc0a:
        if ((*local_58 < 0x41) || (0x5a < *local_58)) {
          *local_80 = *local_58;
        }
        else {
          *local_80 = *local_58 + 0x20;
        }
        local_80 = local_80 + 1;
        local_58 = local_58 + 1;
      }
      pbVar8 = local_58 + 1;
      local_74 = (uint)*local_58;
      local_58 = pbVar8;
      if (0xbf < local_74) {
        local_74 = (uint)""[local_74 - 0xc0];
        while( true ) {
          bVar9 = false;
          if (local_58 < pbVar6) {
            bVar9 = (*local_58 & 0xc0) == 0x80;
          }
          if (!bVar9) break;
          local_74 = local_74 * 0x40 + (*local_58 & 0x3f);
          local_58 = local_58 + 1;
        }
        if (((local_74 < 0x80) || ((local_74 & 0xfffff800) == 0xd800)) ||
           ((local_74 & 0xfffffffe) == 0xfffe)) {
          local_74 = 0xfffd;
        }
        in_stack_ffffffffffffff76 = 0;
      }
      iVar4 = fts5UnicodeIsAlnum((Unicode61Tokenizer *)
                                 CONCAT17(in_stack_ffffffffffffff77,
                                          CONCAT16(in_stack_ffffffffffffff76,
                                                   in_stack_ffffffffffffff70)),
                                 in_stack_ffffffffffffff6c);
    } while ((iVar4 != 0) || (iVar4 = sqlite3Fts5UnicodeIsdiacritic(local_74), iVar4 != 0));
LAB_0028fc86:
    local_3c = (*in_R9)(in_RSI,0,local_60,(long)local_80 - (long)local_60,local_84,iVar3 - iVar1);
  }
LAB_0028fcbe:
  if (local_3c == 0x65) {
    local_3c = 0;
  }
  return local_3c;
}

Assistant:

static int fts5UnicodeTokenize(
  Fts5Tokenizer *pTokenizer,
  void *pCtx,
  int iUnused,
  const char *pText, int nText,
  int (*xToken)(void*, int, const char*, int nToken, int iStart, int iEnd)
){
  Unicode61Tokenizer *p = (Unicode61Tokenizer*)pTokenizer;
  int rc = SQLITE_OK;
  unsigned char *a = p->aTokenChar;

  unsigned char *zTerm = (unsigned char*)&pText[nText];
  unsigned char *zCsr = (unsigned char *)pText;

  /* Output buffer */
  char *aFold = p->aFold;
  int nFold = p->nFold;
  const char *pEnd = &aFold[nFold-6];

  UNUSED_PARAM(iUnused);

  /* Each iteration of this loop gobbles up a contiguous run of separators,
  ** then the next token.  */
  while( rc==SQLITE_OK ){
    u32 iCode;                    /* non-ASCII codepoint read from input */
    char *zOut = aFold;
    int is;
    int ie;

    /* Skip any separator characters. */
    while( 1 ){
      if( zCsr>=zTerm ) goto tokenize_done;
      if( *zCsr & 0x80 ) {
        /* A character outside of the ascii range. Skip past it if it is
        ** a separator character. Or break out of the loop if it is not. */
        is = zCsr - (unsigned char*)pText;
        READ_UTF8(zCsr, zTerm, iCode);
        if( fts5UnicodeIsAlnum(p, iCode) ){
          goto non_ascii_tokenchar;
        }
      }else{
        if( a[*zCsr] ){
          is = zCsr - (unsigned char*)pText;
          goto ascii_tokenchar;
        }
        zCsr++;
      }
    }

    /* Run through the tokenchars. Fold them into the output buffer along
    ** the way.  */
    while( zCsr<zTerm ){

      /* Grow the output buffer so that there is sufficient space to fit the
      ** largest possible utf-8 character.  */
      if( zOut>pEnd ){
        aFold = sqlite3_malloc64((sqlite3_int64)nFold*2);
        if( aFold==0 ){
          rc = SQLITE_NOMEM;
          goto tokenize_done;
        }
        zOut = &aFold[zOut - p->aFold];
        memcpy(aFold, p->aFold, nFold);
        sqlite3_free(p->aFold);
        p->aFold = aFold;
        p->nFold = nFold = nFold*2;
        pEnd = &aFold[nFold-6];
      }

      if( *zCsr & 0x80 ){
        /* An non-ascii-range character. Fold it into the output buffer if
        ** it is a token character, or break out of the loop if it is not. */
        READ_UTF8(zCsr, zTerm, iCode);
        if( fts5UnicodeIsAlnum(p,iCode)||sqlite3Fts5UnicodeIsdiacritic(iCode) ){
 non_ascii_tokenchar:
          iCode = sqlite3Fts5UnicodeFold(iCode, p->eRemoveDiacritic);
          if( iCode ) WRITE_UTF8(zOut, iCode);
        }else{
          break;
        }
      }else if( a[*zCsr]==0 ){
        /* An ascii-range separator character. End of token. */
        break;
      }else{
 ascii_tokenchar:
        if( *zCsr>='A' && *zCsr<='Z' ){
          *zOut++ = *zCsr + 32;
        }else{
          *zOut++ = *zCsr;
        }
        zCsr++;
      }
      ie = zCsr - (unsigned char*)pText;
    }

    /* Invoke the token callback */
    rc = xToken(pCtx, 0, aFold, zOut-aFold, is, ie);
  }

 tokenize_done:
  if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  return rc;
}